

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::MessageGenerator
          (MessageGenerator *this,Descriptor *descriptor,Options *options)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator> *psVar8;
  MessageGenerator *this_00;
  Descriptor *descriptor_00;
  scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator> *psVar9;
  EnumGenerator *this_01;
  EnumDescriptor *descriptor_01;
  scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator> *psVar10;
  ExtensionGenerator *this_02;
  FieldDescriptor *descriptor_02;
  bool in_CL;
  ulong uVar11;
  scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator> *local_120;
  scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator> *local_d8;
  scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator> *local_90;
  int local_38;
  int local_34;
  int i_2;
  int i_1;
  int i;
  Options *options_local;
  Descriptor *descriptor_local;
  MessageGenerator *this_local;
  
  this->descriptor_ = descriptor;
  ClassName_abi_cxx11_(&this->classname_,(cxx *)descriptor,(Descriptor *)0x0,in_CL);
  Options::Options(&this->options_,options);
  FieldGeneratorMap::FieldGeneratorMap(&this->field_generators_,descriptor,options);
  iVar4 = Descriptor::nested_type_count(descriptor);
  uVar5 = (ulong)iVar4;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar5;
  uVar6 = SUB168(auVar1 * ZEXT816(8),0);
  uVar11 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar11 = 0xffffffffffffffff;
  }
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  puVar7 = (ulong *)operator_new__(uVar11);
  *puVar7 = uVar5;
  psVar8 = (scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator> *)(puVar7 + 1);
  if (uVar5 != 0) {
    local_90 = psVar8;
    do {
      internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::scoped_ptr
                (local_90,(MessageGenerator *)0x0);
      local_90 = local_90 + 1;
    } while (local_90 != psVar8 + uVar5);
  }
  internal::
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
  ::scoped_array(&this->nested_generators_,psVar8);
  iVar4 = Descriptor::enum_type_count(descriptor);
  uVar5 = (ulong)iVar4;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar5;
  uVar6 = SUB168(auVar2 * ZEXT816(8),0);
  uVar11 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar11 = 0xffffffffffffffff;
  }
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  puVar7 = (ulong *)operator_new__(uVar11);
  *puVar7 = uVar5;
  psVar9 = (scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator> *)(puVar7 + 1);
  if (uVar5 != 0) {
    local_d8 = psVar9;
    do {
      internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>::scoped_ptr
                (local_d8,(EnumGenerator *)0x0);
      local_d8 = local_d8 + 1;
    } while (local_d8 != psVar9 + uVar5);
  }
  internal::
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>_>
  ::scoped_array(&this->enum_generators_,psVar9);
  iVar4 = Descriptor::extension_count(descriptor);
  uVar5 = (ulong)iVar4;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar5;
  uVar6 = SUB168(auVar3 * ZEXT816(8),0);
  uVar11 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar11 = 0xffffffffffffffff;
  }
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  puVar7 = (ulong *)operator_new__(uVar11);
  *puVar7 = uVar5;
  psVar10 = (scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator> *)(puVar7 + 1);
  if (uVar5 != 0) {
    local_120 = psVar10;
    do {
      internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>::scoped_ptr
                (local_120,(ExtensionGenerator *)0x0);
      local_120 = local_120 + 1;
    } while (local_120 != psVar10 + uVar5);
  }
  internal::
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>_>
  ::scoped_array(&this->extension_generators_,psVar10);
  i_2 = 0;
  while( true ) {
    iVar4 = Descriptor::nested_type_count(descriptor);
    if (iVar4 <= i_2) break;
    psVar8 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
             ::operator[](&this->nested_generators_,(long)i_2);
    this_00 = (MessageGenerator *)operator_new(0x78);
    descriptor_00 = Descriptor::nested_type(descriptor,i_2);
    MessageGenerator(this_00,descriptor_00,options);
    internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::reset(psVar8,this_00);
    i_2 = i_2 + 1;
  }
  local_34 = 0;
  while( true ) {
    iVar4 = Descriptor::enum_type_count(descriptor);
    if (iVar4 <= local_34) break;
    psVar9 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>_>
             ::operator[](&this->enum_generators_,(long)local_34);
    this_01 = (EnumGenerator *)operator_new(0x50);
    descriptor_01 = Descriptor::enum_type(descriptor,local_34);
    EnumGenerator::EnumGenerator(this_01,descriptor_01,options);
    internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>::reset(psVar9,this_01);
    local_34 = local_34 + 1;
  }
  local_38 = 0;
  while( true ) {
    iVar4 = Descriptor::extension_count(descriptor);
    if (iVar4 <= local_38) break;
    psVar10 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>_>
              ::operator[](&this->extension_generators_,(long)local_38);
    this_02 = (ExtensionGenerator *)operator_new(0x50);
    descriptor_02 = Descriptor::extension(descriptor,local_38);
    ExtensionGenerator::ExtensionGenerator(this_02,descriptor_02,options);
    internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>::reset
              (psVar10,this_02);
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

MessageGenerator::MessageGenerator(const Descriptor* descriptor,
                                   const Options& options)
  : descriptor_(descriptor),
    classname_(ClassName(descriptor, false)),
    options_(options),
    field_generators_(descriptor, options),
    nested_generators_(new scoped_ptr<MessageGenerator>[
      descriptor->nested_type_count()]),
    enum_generators_(new scoped_ptr<EnumGenerator>[
      descriptor->enum_type_count()]),
    extension_generators_(new scoped_ptr<ExtensionGenerator>[
      descriptor->extension_count()]) {

  for (int i = 0; i < descriptor->nested_type_count(); i++) {
    nested_generators_[i].reset(
      new MessageGenerator(descriptor->nested_type(i), options));
  }

  for (int i = 0; i < descriptor->enum_type_count(); i++) {
    enum_generators_[i].reset(
      new EnumGenerator(descriptor->enum_type(i), options));
  }

  for (int i = 0; i < descriptor->extension_count(); i++) {
    extension_generators_[i].reset(
      new ExtensionGenerator(descriptor->extension(i), options));
  }
}